

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O0

bool __thiscall ON_Extrusion::IsPlanar(ON_Extrusion *this,ON_Plane *plane,double tolerance)

{
  bool bVar1;
  uint uVar2;
  ON_3dVector local_1d8;
  ON_3dVector local_1c0;
  ON_3dVector local_1a8;
  ON_3dVector local_190;
  undefined1 local_178 [8];
  ON_3dVector N;
  ON_3dVector local_148;
  ON_3dPoint local_130;
  undefined1 local_118 [8];
  ON_3dPoint Q1;
  ON_3dVector local_e8;
  ON_3dPoint local_d0;
  undefined1 local_b8 [8];
  ON_3dPoint Q0;
  ON_3dVector X;
  ON_3dVector Y;
  ON_3dVector pathT;
  ON_3dPoint P1;
  ON_3dPoint P0;
  double tolerance_local;
  ON_Plane *plane_local;
  ON_Extrusion *this_local;
  
  if ((this->m_profile == (ON_Curve *)0x0) ||
     (uVar2 = (*(this->m_profile->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2e])
                        (tolerance), (uVar2 & 1) == 0)) {
    this_local._7_1_ = false;
  }
  else {
    if (plane != (ON_Plane *)0x0) {
      ON_Curve::PointAtStart((ON_3dPoint *)&P1.z,this->m_profile);
      ON_Curve::PointAtEnd((ON_3dPoint *)&pathT.z,this->m_profile);
      ON_Line::Tangent((ON_3dVector *)&Y.z,&this->m_path);
      X.z = (this->m_up).x;
      Y.x = (this->m_up).y;
      Y.y = (this->m_up).z;
      ON_CrossProduct((ON_3dVector *)&Q0.z,(ON_3dVector *)&X.z,(ON_3dVector *)&Y.z);
      bVar1 = ON_3dVector::IsUnitVector((ON_3dVector *)&Q0.z);
      if (!bVar1) {
        ON_3dVector::Unitize((ON_3dVector *)&Q0.z);
      }
      ::operator*(&local_e8,P1.z,(ON_3dVector *)&Q0.z);
      ON_3dPoint::operator+(&local_d0,&(this->m_path).from,&local_e8);
      ::operator*((ON_3dVector *)&Q1.z,P0.x,(ON_3dVector *)&X.z);
      ON_3dPoint::operator+((ON_3dPoint *)local_b8,&local_d0,(ON_3dVector *)&Q1.z);
      ::operator*(&local_148,pathT.z,(ON_3dVector *)&Q0.z);
      ON_3dPoint::operator+(&local_130,&(this->m_path).from,&local_148);
      ::operator*((ON_3dVector *)&N.z,P1.x,(ON_3dVector *)&X.z);
      ON_3dPoint::operator+((ON_3dPoint *)local_118,&local_130,(ON_3dVector *)&N.z);
      ON_3dPoint::operator-(&local_190,(ON_3dPoint *)local_118,(ON_3dPoint *)local_b8);
      ON_CrossProduct((ON_3dVector *)local_178,(ON_3dVector *)&Y.z,&local_190);
      ON_3dVector::Unitize((ON_3dVector *)local_178);
      (plane->origin).x = (double)local_b8;
      (plane->origin).y = Q0.x;
      (plane->origin).z = Q0.y;
      if ((this->m_bTransposed & 1U) == 0) {
        (plane->yaxis).x = Y.z;
        (plane->yaxis).y = pathT.x;
        (plane->yaxis).z = pathT.y;
        ON_3dVector::operator-(&local_1a8,(ON_3dVector *)local_178);
        (plane->zaxis).x = local_1a8.x;
        (plane->zaxis).y = local_1a8.y;
        (plane->zaxis).z = local_1a8.z;
        ON_CrossProduct(&local_1c0,&plane->yaxis,&plane->zaxis);
        (plane->xaxis).x = local_1c0.x;
        (plane->xaxis).y = local_1c0.y;
        (plane->xaxis).z = local_1c0.z;
        ON_3dVector::Unitize(&plane->xaxis);
      }
      else {
        (plane->xaxis).x = Y.z;
        (plane->xaxis).y = pathT.x;
        (plane->xaxis).z = pathT.y;
        (plane->zaxis).x = (double)local_178;
        (plane->zaxis).y = N.x;
        (plane->zaxis).z = N.y;
        ON_CrossProduct(&local_1d8,&plane->zaxis,&plane->xaxis);
        (plane->yaxis).x = local_1d8.x;
        (plane->yaxis).y = local_1d8.y;
        (plane->yaxis).z = local_1d8.z;
        ON_3dVector::Unitize(&plane->yaxis);
      }
      ON_Plane::UpdateEquation(plane);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Extrusion::IsPlanar(
      ON_Plane* plane,
      double tolerance
      ) const
{
  if ( m_profile && m_profile->IsLinear(tolerance) )
  {
    if ( plane )
    {
      ON_3dPoint P0 = m_profile->PointAtStart();
      ON_3dPoint P1 = m_profile->PointAtEnd();
      ON_3dVector pathT = m_path.Tangent();
      ON_3dVector Y = m_up;
      ON_3dVector X = ON_CrossProduct(Y,pathT);
      if ( !X.IsUnitVector() )
        X.Unitize();
      ON_3dPoint Q0 = m_path.from + P0.x*X + P0.y*Y;
      ON_3dPoint Q1 = m_path.from + P1.x*X + P1.y*Y;
      ON_3dVector N = ON_CrossProduct(pathT,Q1-Q0);
      N.Unitize();
      plane->origin = Q0;
      if ( false == m_bTransposed )
      {
        plane->yaxis = pathT;
        plane->zaxis = -N;
        plane->xaxis = ON_CrossProduct(plane->yaxis,plane->zaxis);
        plane->xaxis.Unitize();
      }
      else
      {
        plane->xaxis = pathT;
        plane->zaxis = N;
        plane->yaxis = ON_CrossProduct(plane->zaxis,plane->xaxis);
        plane->yaxis.Unitize();
      }
      plane->UpdateEquation();
    }    
    return true;
  }
  return false;
}